

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

void nghttp2_map_print_distance(nghttp2_map *map)

{
  long lVar1;
  ulong uVar2;
  
  if (map->tablelen != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      if (*(long *)((long)&map->table->data + lVar1) == 0) {
        fprintf(_stderr,"@%u <EMPTY>\n",uVar2 & 0xffffffff);
      }
      else {
        nghttp2_map_print_distance_cold_1();
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < map->tablelen);
  }
  return;
}

Assistant:

void nghttp2_map_print_distance(nghttp2_map *map) {
  uint32_t i;
  size_t idx;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      fprintf(stderr, "@%u <EMPTY>\n", i);
      continue;
    }

    idx = h2idx(bkt->hash, map->tablelenbits);
    fprintf(stderr, "@%u hash=%08x key=%d base=%zu distance=%zu\n", i,
            bkt->hash, bkt->key, idx,
            distance(map->tablelen, map->tablelenbits, bkt, idx));
  }
}